

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

void Saig_ManMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  for (; (pObj != (Aig_Obj_t *)0x0 && (pObj->TravId != p->nTravIds));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe)) {
    pObj->TravId = p->nTravIds;
    Saig_ManMarkCone_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

void Saig_ManMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj == NULL )
        return;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin0(pObj) );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin1(pObj) );
}